

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O1

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Bool,_(ritobin::Category)1>::from_json
          (ErrorStackOption *__return_storage_ptr__,Bool *value,json *json)

{
  undefined8 local_f;
  undefined4 local_7;
  undefined2 local_3;
  undefined1 local_1;
  
  if (json->m_type == boolean) {
    value->value = (json->m_value).boolean;
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type = "bool"
  ;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
       "json.is_boolean()";
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_dataplus._M_p =
       (pointer)((long)&(__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload
                + 0x20);
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path
           .field_2 + 1) = local_f;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x29) =
       local_7;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2d) =
       local_3;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2f) =
       local_1;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_string_length = 0;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            using value_t = std::remove_cvref_t<decltype(value.value)>;
            if constexpr (std::is_same_v<value_t, bool>) {
                bin_json_assert(json.is_boolean());
            } else {
                bin_json_assert(json.is_number());
            }
            value.value = json;
            return std::nullopt;
        }